

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O3

Vec_Int_t * Sbc_ManWlcNodes2(Wlc_Ntk_t *pNtk,Gia_Man_t *p,Vec_Int_t *vGiaLits)

{
  uint uVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  void *__s;
  char *pcVar6;
  int i;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  size_t __nmemb;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(400);
  p_00->pArray = piVar5;
  iVar13 = p->nObjs;
  iVar11 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar11 = iVar13;
  }
  if (iVar11 != 0) {
    __s = malloc((long)iVar11 << 2);
    if (__s != (void *)0x0) {
      memset(__s,0xff,(long)iVar13 * 4);
      goto LAB_0035d2cd;
    }
  }
  __s = (void *)0x0;
LAB_0035d2cd:
  iVar11 = vGiaLits->nSize;
  if (0 < (long)iVar11) {
    piVar5 = vGiaLits->pArray;
    iVar8 = 0;
    uVar12 = 0;
    do {
      uVar15 = piVar5[uVar12];
      if (uVar15 != 0xffffffff) {
        if ((int)uVar15 < 0) {
LAB_0035d682:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if (iVar13 <= (int)(uVar15 >> 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(uint *)((long)__s + (ulong)(uVar15 >> 1) * 4) = (uVar15 & 1) + iVar8;
      }
      uVar12 = uVar12 + 1;
      iVar8 = iVar8 + 2;
    } while (uVar12 < (ulong)(long)iVar11);
  }
  if (1 < pNtk->iObj) {
    uVar12 = 1;
    do {
      if ((long)pNtk->nObjsAlloc <= (long)uVar12) goto LAB_0035d6fe;
      if ((long)(pNtk->vCopies).nSize <= (long)uVar12) goto LAB_0035d663;
      pWVar2 = pNtk->pObjs;
      iVar11 = (pNtk->vCopies).pArray[uVar12];
      iVar3 = pWVar2[uVar12].End - pWVar2[uVar12].Beg;
      iVar8 = -iVar3;
      if (0 < iVar3) {
        iVar8 = iVar3;
      }
      uVar14 = 0;
      do {
        if ((iVar11 < 0) || (lVar9 = uVar14 + (long)iVar11, (pNtk->vBits).nSize <= lVar9))
        goto LAB_0035d663;
        uVar15 = (pNtk->vBits).pArray[lVar9];
        if ((int)uVar15 < 0) goto LAB_0035d682;
        uVar4 = uVar15 >> 1;
        if (iVar13 <= (int)uVar4) goto LAB_0035d663;
        uVar1 = *(uint *)((long)__s + (ulong)uVar4 * 4);
        if (uVar1 != 0xffffffff) {
          *(undefined4 *)((long)__s + (ulong)uVar4 * 4) = 0xffffffff;
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pcVar6 = Wlc_ObjName(pNtk,(int)((long)pWVar2 + (uVar12 * 0x18 - (long)pNtk->pObjs) >> 3) *
                                    -0x55555555);
          printf("Matched out %d in phase %d with object %d (%s) bit %d (out of %d).\n",
                 (ulong)(uVar1 >> 1),(ulong)((uVar15 ^ uVar1) & 1),uVar12 & 0xffffffff,pcVar6,
                 uVar14 & 0xffffffff,iVar8 + 1U);
          if (0 < (long)p_00->nSize) {
            lVar9 = 0;
            do {
              if (uVar12 == (uint)p_00->pArray[lVar9]) goto LAB_0035d485;
              lVar9 = lVar9 + 1;
            } while (p_00->nSize != lVar9);
          }
          Vec_IntPush(p_00,(int)uVar12);
        }
LAB_0035d485:
        uVar14 = uVar14 + 1;
      } while (uVar14 != iVar8 + 1U);
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)pNtk->iObj);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  __nmemb = (size_t)p_00->nSize;
  piVar5 = p_00->pArray;
  qsort(piVar5,__nmemb,4,Vec_IntSortCompare1);
  if ((long)__nmemb < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar15 = piVar5[__nmemb - 1];
  lVar9 = (long)(int)uVar15;
  if ((lVar9 < 1) || (pNtk->nObjsAlloc <= (int)uVar15)) {
LAB_0035d6fe:
    __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                  ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
  }
  if ((int)uVar15 < (pNtk->vCopies).nSize) {
    uVar4 = (pNtk->vCopies).pArray[lVar9];
    iVar11 = pNtk->pObjs[lVar9].Beg - pNtk->pObjs[lVar9].End;
    pcVar6 = Wlc_ObjName(pNtk,uVar15);
    printf("Considering object %d (%s):\n",(ulong)uVar15,pcVar6);
    iVar13 = -iVar11;
    if (0 < iVar11) {
      iVar13 = iVar11;
    }
    uVar12 = 0;
    while ((-1 < (int)uVar4 && (lVar9 = uVar4 + uVar12, (int)lVar9 < (pNtk->vBits).nSize))) {
      uVar15 = (pNtk->vBits).pArray[lVar9];
      lVar9 = (long)vGiaLits->nSize;
      if (lVar9 < 1) {
        lVar10 = 0xffffffff;
        lVar7 = 0xffffffff;
        if ((int)uVar15 < 0) goto LAB_0035d6df;
      }
      else {
        lVar10 = 0;
        do {
          if (vGiaLits->pArray[lVar10] == uVar15) goto LAB_0035d5b1;
          lVar10 = lVar10 + 1;
        } while (lVar9 != lVar10);
        lVar10 = 0xffffffff;
LAB_0035d5b1:
        if ((int)uVar15 < 0) {
LAB_0035d6df:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        lVar7 = 0;
        do {
          if ((vGiaLits->pArray[lVar7] ^ uVar15) == 1) goto LAB_0035d5e9;
          lVar7 = lVar7 + 1;
        } while (lVar9 != lVar7);
        lVar7 = 0xffffffff;
      }
LAB_0035d5e9:
      printf("Matching bit %d with output %d / %d.\n",uVar12 & 0xffffffff,lVar10,lVar7);
      uVar15 = (uVar15 >> 1) * p->nSimWords;
      if (((int)uVar15 < 0) || (p->vSims->nSize <= (int)uVar15)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      Extra_PrintHex(_stdout,(uint *)(p->vSims->pArray + uVar15),6);
      putchar(10);
      uVar12 = uVar12 + 1;
      if (uVar12 == iVar13 + 1) {
        return p_00;
      }
    }
  }
LAB_0035d663:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Sbc_ManWlcNodes2( Wlc_Ntk_t * pNtk, Gia_Man_t * p, Vec_Int_t * vGiaLits )
{
    Wlc_Obj_t * pObj;  int i, k, iGiaLit, iFirst, nBits;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_IntForEachEntry( vGiaLits, iGiaLit, i )
        if ( iGiaLit != -1 )
            Vec_IntWriteEntry( vMap, Abc_Lit2Var(iGiaLit), Abc_Var2Lit(i, Abc_LitIsCompl(iGiaLit)) );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        iFirst = Vec_IntEntry( &pNtk->vCopies, i );
        nBits  = Wlc_ObjRange(pObj);
        for ( k = 0; k < nBits; k++ )
        {
            int iLitGia = Vec_IntEntry( &pNtk->vBits, iFirst + k );
            int iLitOut = Vec_IntEntry( vMap, Abc_Lit2Var(iLitGia) );
            if ( iLitOut == -1 )
                continue;
            Vec_IntWriteEntry( vMap, Abc_Lit2Var(iLitGia), -1 );
            iLitOut = Abc_LitNotCond( iLitOut, Abc_LitIsCompl(iLitGia) );
            printf( "Matched out %d in phase %d with object %d (%s) bit %d (out of %d).\n", Abc_Lit2Var(iLitOut), Abc_LitIsCompl(iLitOut), i, Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k, nBits );
            Vec_IntPushUnique( vRes, i );
        }
    }
    Vec_IntFree( vMap );
    Vec_IntSort( vRes, 0 );
    // consider the last one
    pObj   = Wlc_NtkObj( pNtk, Vec_IntEntryLast(vRes) );
    iFirst = Vec_IntEntry( &pNtk->vCopies, Wlc_ObjId(pNtk, pObj) );
    nBits  = Wlc_ObjRange(pObj);
    printf( "Considering object %d (%s):\n", Wlc_ObjId(pNtk, pObj), Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLitGia  = Vec_IntEntry( &pNtk->vBits, iFirst + k );
        int iLitOutP = Vec_IntFind( vGiaLits, iLitGia );
        int iLitOutN = Vec_IntFind( vGiaLits, Abc_LitNot(iLitGia) );
        printf( "Matching bit %d with output %d / %d.\n", k, iLitOutP, iLitOutN );
        // print simulation signature
        {
            word * pInfoObj = Wlc_ObjSim( p, Abc_Lit2Var(iLitGia) );
            Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
        }
    }
    return vRes;
}